

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

lu_mem singlestep(lua_State *L)

{
  bool bVar1;
  int iVar2;
  GCObject **ppGVar3;
  GCObject *local_40;
  GCObject *mt;
  int i;
  int sw;
  lu_mem work;
  lu_mem oldtrav;
  global_State *g;
  lua_State *L_local;
  
  oldtrav = (lu_mem)L->l_G;
  g = (global_State *)L;
  switch(((global_State *)oldtrav)->gcstate) {
  case '\0':
    if (((global_State *)oldtrav)->gray == (GCObject *)0x0) {
      ((global_State *)oldtrav)->gcstate = '\x01';
      ((global_State *)oldtrav)->GCestimate = ((global_State *)oldtrav)->GCmemtrav;
      _i = atomic(L);
      *(l_mem *)(oldtrav + 0x28) = _i + *(long *)(oldtrav + 0x28);
      iVar2 = entersweep((lua_State *)g);
      L_local = (lua_State *)(_i + (long)iVar2 * 7);
    }
    else {
      work = ((global_State *)oldtrav)->GCmemtrav;
      propagatemark((global_State *)oldtrav);
      L_local = (lua_State *)(*(long *)(oldtrav + 0x20) - work);
    }
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case '\x02':
    mt._0_4_ = 0;
    while( true ) {
      bVar1 = false;
      if ((int)mt < 0x55) {
        bVar1 = *(int *)(oldtrav + 0x58) + (int)mt < *(int *)(oldtrav + 0x3c);
      }
      if (!bVar1) break;
      sweeplist((lua_State *)g,
                (GCObject **)
                (*(long *)(oldtrav + 0x30) + (long)(*(int *)(oldtrav + 0x58) + (int)mt) * 8),
                0xfffffffffffffffd);
      mt._0_4_ = (int)mt + 1;
    }
    *(int *)(oldtrav + 0x58) = (int)mt + *(int *)(oldtrav + 0x58);
    if (*(int *)(oldtrav + 0x3c) <= *(int *)(oldtrav + 0x58)) {
      *(undefined1 *)(oldtrav + 0x55) = 3;
    }
    L_local = (lua_State *)((long)(int)mt * 7);
    break;
  case '\x03':
    if (((global_State *)oldtrav)->sweepfin == (GCObject **)0x0) {
      ((global_State *)oldtrav)->gcstate = '\x04';
      L_local = (lua_State *)0x0;
    }
    else {
      ppGVar3 = sweeplist(L,((global_State *)oldtrav)->sweepfin,0x55);
      *(GCObject ***)(oldtrav + 0x78) = ppGVar3;
      L_local = (lua_State *)0x253;
    }
    break;
  case '\x04':
    if (((global_State *)oldtrav)->sweepgc == (GCObject **)0x0) {
      local_40 = (GCObject *)((global_State *)oldtrav)->mainthread;
      sweeplist(L,&local_40,1);
      checkSizes((lua_State *)g);
      *(undefined1 *)(oldtrav + 0x55) = 5;
      L_local = (lua_State *)0x7;
    }
    else {
      ppGVar3 = sweeplist(L,((global_State *)oldtrav)->sweepgc,0x55);
      *(GCObject ***)(oldtrav + 0x70) = ppGVar3;
      L_local = (lua_State *)0x253;
    }
    break;
  case '\x05':
    ((global_State *)oldtrav)->GCmemtrav = (long)(((global_State *)oldtrav)->strt).size << 3;
    restartcollection((global_State *)oldtrav);
    *(undefined1 *)(oldtrav + 0x55) = 0;
    L_local = *(lua_State **)(oldtrav + 0x20);
  }
  return (lu_mem)L_local;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  switch (g->gcstate) {
    case GCSpause: {
      /* start to count memory traversed */
      g->GCmemtrav = g->strt.size * sizeof(GCObject*);
      lua_assert(!isgenerational(g));
      restartcollection(g);
      g->gcstate = GCSpropagate;
      return g->GCmemtrav;
    }
    case GCSpropagate: {
      if (g->gray) {
        lu_mem oldtrav = g->GCmemtrav;
        propagatemark(g);
        return g->GCmemtrav - oldtrav;  /* memory traversed in this step */
      }
      else {  /* no more `gray' objects */
        lu_mem work;
        int sw;
        g->gcstate = GCSatomic;  /* finish mark phase */
        g->GCestimate = g->GCmemtrav;  /* save what was counted */;
        work = atomic(L);  /* add what was traversed by 'atomic' */
        g->GCestimate += work;  /* estimate of total memory traversed */ 
        sw = entersweep(L);
        return work + sw * GCSWEEPCOST;
      }
    }
    case GCSsweepstring: {
      int i;
      for (i = 0; i < GCSWEEPMAX && g->sweepstrgc + i < g->strt.size; i++)
        sweepwholelist(L, &g->strt.hash[g->sweepstrgc + i]);
      g->sweepstrgc += i;
      if (g->sweepstrgc >= g->strt.size)  /* no more strings to sweep? */
        g->gcstate = GCSsweepudata;
      return i * GCSWEEPCOST;
    }
    case GCSsweepudata: {
      if (g->sweepfin) {
        g->sweepfin = sweeplist(L, g->sweepfin, GCSWEEPMAX);
        return GCSWEEPMAX*GCSWEEPCOST;
      }
      else {
        g->gcstate = GCSsweep;
        return 0;
      }
    }
    case GCSsweep: {
      if (g->sweepgc) {
        g->sweepgc = sweeplist(L, g->sweepgc, GCSWEEPMAX);
        return GCSWEEPMAX*GCSWEEPCOST;
      }
      else {
        /* sweep main thread */
        GCObject *mt = obj2gco(g->mainthread);
        sweeplist(L, &mt, 1);
        checkSizes(L);
        g->gcstate = GCSpause;  /* finish collection */
        return GCSWEEPCOST;
      }
    }
    default: lua_assert(0); return 0;
  }
}